

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O2

char * CB::bufread_label(label *ld,char *c,io_buf *cache)

{
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  bool bVar4;
  cb_class temp;
  char *local_40;
  cb_class local_38;
  
  lVar3 = *(long *)c;
  v_array<CB::cb_class>::clear(&ld->costs);
  local_40 = c + 8;
  sVar1 = io_buf::buf_read(cache,&local_40,lVar3 << 4);
  if (sVar1 < (ulong)(lVar3 << 4)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"error in demarshal of cost data");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      local_38._0_8_ = *(undefined8 *)local_40;
      local_38._8_8_ = *(undefined8 *)(local_40 + 8);
      local_40 = local_40 + 0x10;
      v_array<CB::cb_class>::push_back(&ld->costs,&local_38);
    }
  }
  return local_40;
}

Assistant:

char* bufread_label(CB::label* ld, char* c, io_buf& cache)
{
  size_t num = *(size_t*)c;
  ld->costs.clear();
  c += sizeof(size_t);
  size_t total = sizeof(cb_class) * num;
  if (cache.buf_read(c, total) < total)
  {
    cout << "error in demarshal of cost data" << endl;
    return c;
  }
  for (size_t i = 0; i < num; i++)
  {
    cb_class temp = *(cb_class*)c;
    c += sizeof(cb_class);
    ld->costs.push_back(temp);
  }

  return c;
}